

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O1

void basic_tests(void)

{
  undefined8 uVar1;
  pointer ptVar2;
  version vVar3;
  wostream *pwVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  long lVar6;
  token *ptVar7;
  token *ptVar8;
  token *ptVar9;
  token *ptVar10;
  token *ptVar11;
  bool bVar12;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  initializer_list<mjs::token> __l_02;
  initializer_list<mjs::token> __l_03;
  initializer_list<mjs::token> __l_04;
  initializer_list<mjs::token> __l_05;
  initializer_list<mjs::token> __l_06;
  initializer_list<mjs::token> __l_07;
  initializer_list<mjs::token> __l_08;
  initializer_list<mjs::token> __l_09;
  initializer_list<mjs::token> __l_10;
  initializer_list<mjs::token> __l_11;
  initializer_list<mjs::token> __l_12;
  initializer_list<mjs::token> __l_13;
  initializer_list<mjs::token> __l_14;
  initializer_list<mjs::token> __l_15;
  initializer_list<mjs::token> __l_16;
  initializer_list<mjs::token> __l_17;
  initializer_list<mjs::token> __l_18;
  initializer_list<mjs::token> __l_19;
  initializer_list<mjs::token> __l_20;
  initializer_list<mjs::token> __l_21;
  initializer_list<mjs::token> __l_22;
  initializer_list<mjs::token> __l_23;
  initializer_list<mjs::token> __l_24;
  initializer_list<mjs::token> __l_25;
  initializer_list<mjs::token> __l_26;
  initializer_list<mjs::token> __l_27;
  initializer_list<mjs::token> __l_28;
  initializer_list<mjs::token> __l_29;
  initializer_list<mjs::token> __l_30;
  initializer_list<mjs::token> __l_31;
  initializer_list<mjs::token> __l_32;
  initializer_list<mjs::token> __l_33;
  initializer_list<mjs::token> __l_34;
  initializer_list<mjs::token> __l_35;
  initializer_list<mjs::token> __l_36;
  initializer_list<mjs::token> __l_37;
  initializer_list<mjs::token> __l_38;
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  vector<mjs::token,_std::allocator<mjs::token>_> _l_1;
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  vector<mjs::token,_std::allocator<mjs::token>_> _l_11;
  vector<mjs::token,_std::allocator<mjs::token>_> _r_11;
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_348 [47];
  allocator_type local_319;
  vector<mjs::token,_std::allocator<mjs::token>_> local_318;
  vector<mjs::token,_std::allocator<mjs::token>_> local_300;
  undefined1 local_2e8 [8];
  anon_union_32_3_e608ca2d_for_token_1 local_2e0;
  token local_2c0;
  token local_298;
  undefined4 local_270;
  undefined8 local_268;
  token local_248;
  undefined4 local_220;
  token local_1f8;
  undefined4 local_1d0;
  token local_1a8;
  undefined4 local_180;
  undefined4 local_158;
  token local_130;
  undefined4 local_108;
  undefined4 local_e0;
  undefined4 local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  local_2e8 = (undefined1  [8])0x7;
  local_2e0.dvalue_ = 8.20071897855718e-318;
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,(wstring_view *)local_2e8);
  local_2e8 = (undefined1  [8])((ulong)local_2e8 & 0xffffffff00000000);
  ptVar9 = (token *)(local_368 + 0x10);
  local_368._0_8_ = ptVar9;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_368,L"ab",L"");
  mjs::token::token(&local_2c0,identifier,(wstring *)local_368);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2e8;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348,__l,
             (allocator_type *)&local_318);
  lVar6 = 0x28;
  do {
    mjs::token::destroy((token *)(local_2e8 + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x28);
  if ((token *)local_368._0_8_ != ptVar9) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ * 4 + 4);
  }
  ptVar11 = (token *)local_348._0_8_;
  uVar1 = local_388._8_8_;
  ptVar7 = (token *)local_388._0_8_;
  if (local_388._8_8_ - local_388._0_8_ == local_348._8_8_ - local_348._0_8_) {
    bVar12 = local_388._0_8_ == local_388._8_8_;
    if (bVar12) {
LAB_00112ce6:
      if (bVar12) {
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                  ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                  ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
        vVar3 = tested_version();
        if (0 < (int)vVar3) {
          local_2e8 = (undefined1  [8])0x3;
          local_2e0.dvalue_ = 8.20087707956385e-318;
          lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368,(wstring_view *)local_2e8
             );
          local_2e8 = (undefined1  [8])((ulong)local_2e8 & 0xffffffff00000000);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_2e8;
          std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                    ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,__l_00,
                     (allocator_type *)local_348);
          mjs::token::destroy((token *)local_2e8);
          uVar1 = local_368._8_8_;
          ptVar7 = (token *)local_368._0_8_;
          ptVar11 = (token *)local_388._0_8_;
          if (local_368._8_8_ - local_368._0_8_ == local_388._8_8_ - local_388._0_8_) {
            bVar12 = local_368._0_8_ == local_368._8_8_;
            if (bVar12) {
LAB_00112ebc:
              if (bVar12) {
                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368);
                goto LAB_00112ed6;
              }
            }
            else {
              bVar12 = mjs::operator==((token *)local_368._0_8_,(token *)local_388._0_8_);
              if (bVar12) {
                do {
                  ptVar11 = ptVar11 + 1;
                  ptVar7 = ptVar7 + 1;
                  bVar12 = ptVar7 == (token *)uVar1;
                  if (bVar12) goto LAB_00112ebc;
                  bVar12 = mjs::operator==(ptVar7,ptVar11);
                } while (bVar12);
              }
            }
          }
          pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
          pwVar4 = std::operator<<(pwVar4," in ");
          pwVar4 = std::operator<<(pwVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                  );
          pwVar4 = std::operator<<(pwVar4,":");
          pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x36);
          pwVar4 = std::operator<<(pwVar4,":\n");
          pwVar4 = std::operator<<(pwVar4,"lex(L\"\\xA0\\x1680\\x2000\")");
          pwVar4 = std::operator<<(pwVar4," != ");
          pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::whitespace})");
          pwVar4 = std::operator<<(pwVar4,"\n");
          pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_368);
          pwVar4 = std::operator<<(pbVar5," != ");
          pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
          pwVar4 = std::operator<<(pbVar5,"\n");
          vVar3 = tested_version();
          pbVar5 = mjs::operator<<(pwVar4,vVar3);
          std::operator<<(pbVar5,"\n");
          goto LAB_00117ce5;
        }
LAB_00112ed6:
        local_2e8 = (undefined1  [8])0x3;
        local_2e0.dvalue_ = 8.20095613006718e-318;
        lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,(wstring_view *)local_2e8);
        local_2e8._0_4_ = 1;
        local_368._0_8_ = ptVar9;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_368,L"x",L"");
        mjs::token::token(&local_2c0,identifier,(wstring *)local_368);
        local_298.type_ = line_terminator;
        __l_01._M_len = 3;
        __l_01._M_array = (iterator)local_2e8;
        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                  ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348,__l_01,
                   (allocator_type *)&local_318);
        lVar6 = 0x50;
        do {
          mjs::token::destroy((token *)(local_2e8 + lVar6));
          lVar6 = lVar6 + -0x28;
        } while (lVar6 != -0x28);
        if ((token *)local_368._0_8_ != ptVar9) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ * 4 + 4);
        }
        ptVar11 = (token *)local_348._0_8_;
        uVar1 = local_388._8_8_;
        ptVar7 = (token *)local_388._0_8_;
        if (local_388._8_8_ - local_388._0_8_ == local_348._8_8_ - local_348._0_8_) {
          bVar12 = local_388._0_8_ == local_388._8_8_;
          if (bVar12) {
LAB_001130f0:
            if (bVar12) {
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                        ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348);
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                        ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
              vVar3 = tested_version();
              if (0 < (int)vVar3) {
                local_2e8 = (undefined1  [8])0x2;
                local_2e0.dvalue_ = 8.20103518057052e-318;
                lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368,
                    (wstring_view *)local_2e8);
                local_2e8._0_4_ = 1;
                __l_02._M_len = 1;
                __l_02._M_array = (iterator)local_2e8;
                std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,__l_02,
                           (allocator_type *)local_348);
                mjs::token::destroy((token *)local_2e8);
                uVar1 = local_368._8_8_;
                ptVar7 = (token *)local_368._0_8_;
                ptVar11 = (token *)local_388._0_8_;
                if (local_368._8_8_ - local_368._0_8_ == local_388._8_8_ - local_388._0_8_) {
                  bVar12 = local_368._0_8_ == local_368._8_8_;
                  if (bVar12) {
LAB_001132c6:
                    if (bVar12) {
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368);
                      local_2e8 = (undefined1  [8])0x4;
                      local_2e0.dvalue_ = 8.20109446844802e-318;
                      lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,
                          (wstring_view *)local_2e8);
                      local_368._0_8_ = ptVar9;
                      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                ((wstring *)local_368,L"x",L"");
                      mjs::token::token((token *)local_2e8,identifier,(wstring *)local_368);
                      local_2c0.type_ = whitespace;
                      local_298.type_ = line_terminator;
                      __l_03._M_len = 3;
                      __l_03._M_array = (iterator)local_2e8;
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348,__l_03
                                 ,(allocator_type *)&local_318);
                      lVar6 = 0x50;
                      do {
                        mjs::token::destroy((token *)(local_2e8 + lVar6));
                        lVar6 = lVar6 + -0x28;
                      } while (lVar6 != -0x28);
                      if ((token *)local_368._0_8_ != ptVar9) {
                        operator_delete((void *)local_368._0_8_,local_368._16_8_ * 4 + 4);
                      }
                      ptVar11 = (token *)local_348._0_8_;
                      uVar1 = local_388._8_8_;
                      ptVar7 = (token *)local_388._0_8_;
                      if (local_388._8_8_ - local_388._0_8_ == local_348._8_8_ - local_348._0_8_) {
                        bVar12 = local_388._0_8_ == local_388._8_8_;
                        if (bVar12) {
LAB_00113506:
                          if (bVar12) {
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                      ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348)
                            ;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                      ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388)
                            ;
                            goto LAB_00113520;
                          }
                        }
                        else {
                          bVar12 = mjs::operator==((token *)local_388._0_8_,(token *)local_348._0_8_
                                                  );
                          if (bVar12) {
                            do {
                              ptVar11 = ptVar11 + 1;
                              ptVar7 = ptVar7 + 1;
                              bVar12 = ptVar7 == (token *)uVar1;
                              if (bVar12) goto LAB_00113506;
                              bVar12 = mjs::operator==(ptVar7,ptVar11);
                            } while (bVar12);
                          }
                        }
                      }
                      pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                      pwVar4 = std::operator<<(pwVar4," in ");
                      pwVar4 = std::operator<<(pwVar4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                              );
                      pwVar4 = std::operator<<(pwVar4,":");
                      pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x3d);
                      pwVar4 = std::operator<<(pwVar4,":\n");
                      pwVar4 = std::operator<<(pwVar4,"lex(L\"x//\\x2029\")");
                      pwVar4 = std::operator<<(pwVar4," != ");
                      pwVar4 = std::operator<<(pwVar4,
                                               "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                                              );
                      pwVar4 = std::operator<<(pwVar4,"\n");
                      pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                 local_388);
                      pwVar4 = std::operator<<(pbVar5," != ");
                      pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                 local_348);
                      pwVar4 = std::operator<<(pbVar5,"\n");
                      vVar3 = tested_version();
                      pbVar5 = mjs::operator<<(pwVar4,vVar3);
                      std::operator<<(pbVar5,"\n");
                      goto LAB_00117ce5;
                    }
                  }
                  else {
                    bVar12 = mjs::operator==((token *)local_368._0_8_,(token *)local_388._0_8_);
                    if (bVar12) {
                      do {
                        ptVar11 = ptVar11 + 1;
                        ptVar7 = ptVar7 + 1;
                        bVar12 = ptVar7 == (token *)uVar1;
                        if (bVar12) goto LAB_001132c6;
                        bVar12 = mjs::operator==(ptVar7,ptVar11);
                      } while (bVar12);
                    }
                  }
                }
                pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                pwVar4 = std::operator<<(pwVar4," in ");
                pwVar4 = std::operator<<(pwVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                        );
                pwVar4 = std::operator<<(pwVar4,":");
                pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x3c);
                pwVar4 = std::operator<<(pwVar4,":\n");
                pwVar4 = std::operator<<(pwVar4,"lex(L\"\\x2028\\x2029\")");
                pwVar4 = std::operator<<(pwVar4," != ");
                pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::line_terminator})");
                pwVar4 = std::operator<<(pwVar4,"\n");
                pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                           local_368);
                pwVar4 = std::operator<<(pbVar5," != ");
                pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                           local_388);
                pwVar4 = std::operator<<(pbVar5,"\n");
                vVar3 = tested_version();
                pbVar5 = mjs::operator<<(pwVar4,vVar3);
                std::operator<<(pbVar5,"\n");
                goto LAB_00117ce5;
              }
LAB_00113520:
              local_2e8 = (undefined1  [8])0x10;
              local_2e0.dvalue_ = 8.20119328157719e-318;
              lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368,
                  (wstring_view *)local_2e8);
              local_2e8 = (undefined1  [8])((ulong)local_2e8 & 0xffffffff00000000);
              __l_04._M_len = 1;
              __l_04._M_array = (iterator)local_2e8;
              std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                        ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,__l_04,
                         (allocator_type *)local_348);
              mjs::token::destroy((token *)local_2e8);
              uVar1 = local_368._8_8_;
              ptVar7 = (token *)local_368._0_8_;
              ptVar11 = (token *)local_388._0_8_;
              if (local_368._8_8_ - local_368._0_8_ == local_388._8_8_ - local_388._0_8_) {
                bVar12 = local_368._0_8_ == local_368._8_8_;
                if (bVar12) {
LAB_001136cf:
                  if (bVar12) {
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368);
                    local_2e8 = (undefined1  [8])0x10;
                    local_2e0.dvalue_ = 8.20152924621636e-318;
                    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368,
                        (wstring_view *)local_2e8);
                    local_2e8._0_4_ = 1;
                    __l_05._M_len = 1;
                    __l_05._M_array = (iterator)local_2e8;
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,__l_05,
                               (allocator_type *)local_348);
                    mjs::token::destroy((token *)local_2e8);
                    uVar1 = local_368._8_8_;
                    ptVar7 = (token *)local_368._0_8_;
                    ptVar11 = (token *)local_388._0_8_;
                    if (local_368._8_8_ - local_368._0_8_ == local_388._8_8_ - local_388._0_8_) {
                      bVar12 = local_368._0_8_ == local_368._8_8_;
                      if (bVar12) {
LAB_00113898:
                        if (bVar12) {
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                    ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                    ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_368);
                          local_2e8 = (undefined1  [8])0x7;
                          local_2e0.dvalue_ = 8.20186521085553e-318;
                          lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,
                              (wstring_view *)local_2e8);
                          local_368._0_8_ = ptVar9;
                          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                    ((wstring *)local_368,L"x",L"");
                          mjs::token::token((token *)local_2e8,identifier,(wstring *)local_368);
                          local_2c0.type_ = whitespace;
                          __l_06._M_len = 2;
                          __l_06._M_array = (iterator)local_2e8;
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                    ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_348,
                                     __l_06,(allocator_type *)&local_318);
                          lVar6 = 0x28;
                          do {
                            mjs::token::destroy((token *)(local_2e8 + lVar6));
                            lVar6 = lVar6 + -0x28;
                          } while (lVar6 != -0x28);
                          if ((token *)local_368._0_8_ != ptVar9) {
                            operator_delete((void *)local_368._0_8_,local_368._16_8_ * 4 + 4);
                          }
                          ptVar11 = (token *)local_348._0_8_;
                          uVar1 = local_388._8_8_;
                          ptVar7 = (token *)local_388._0_8_;
                          if (local_388._8_8_ - local_388._0_8_ == local_348._8_8_ - local_348._0_8_
                             ) {
                            bVar12 = local_388._0_8_ == local_388._8_8_;
                            if (bVar12) {
LAB_00113ad0:
                              if (bVar12) {
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                           local_348);
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                           local_388);
                                local_2e8 = (undefined1  [8])0x8;
                                local_2e0.dvalue_ = 8.2020233118622e-318;
                                lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_388,
                                    (wstring_view *)local_2e8);
                                local_368._0_8_ = ptVar9;
                                std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                          ((wstring *)local_368,L"x",L"");
                                mjs::token::token((token *)local_2e8,identifier,(wstring *)local_368
                                                 );
                                local_2c0.type_ = whitespace;
                                local_298.type_ = line_terminator;
                                __l_07._M_len = 3;
                                __l_07._M_array = (iterator)local_2e8;
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                          ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                           local_348,__l_07,(allocator_type *)&local_318);
                                lVar6 = 0x50;
                                do {
                                  mjs::token::destroy((token *)(local_2e8 + lVar6));
                                  lVar6 = lVar6 + -0x28;
                                } while (lVar6 != -0x28);
                                if ((token *)local_368._0_8_ != ptVar9) {
                                  operator_delete((void *)local_368._0_8_,local_368._16_8_ * 4 + 4);
                                }
                                ptVar11 = (token *)local_348._0_8_;
                                uVar1 = local_388._8_8_;
                                ptVar7 = (token *)local_388._0_8_;
                                if (local_388._8_8_ - local_388._0_8_ ==
                                    local_348._8_8_ - local_348._0_8_) {
                                  bVar12 = local_388._0_8_ == local_388._8_8_;
                                  if (bVar12) {
LAB_00113d0d:
                                    if (bVar12) {
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                 local_348);
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                 local_388);
                                      local_2e8 = (undefined1  [8])0x3;
                                      local_2e0.dvalue_ = 8.2022011754947e-318;
                                      lex((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                          local_368,(wstring_view *)local_2e8);
                                      local_2e8._0_4_ = 0x4c;
                                      __l_08._M_len = 1;
                                      __l_08._M_array = (iterator)local_2e8;
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                                ((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                 local_388,__l_08,(allocator_type *)local_348);
                                      mjs::token::destroy((token *)local_2e8);
                                      uVar1 = local_368._8_8_;
                                      ptVar7 = (token *)local_368._0_8_;
                                      ptVar11 = (token *)local_388._0_8_;
                                      if (local_368._8_8_ - local_368._0_8_ ==
                                          local_388._8_8_ - local_388._0_8_) {
                                        bVar12 = local_368._0_8_ == local_368._8_8_;
                                        if (bVar12) {
LAB_00113ed6:
                                          if (bVar12) {
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            ~vector((vector<mjs::token,_std::allocator<mjs::token>_>
                                                     *)local_388);
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            ~vector((vector<mjs::token,_std::allocator<mjs::token>_>
                                                     *)local_368);
                                            local_2e8 = (undefined1  [8])0x4;
                                            local_2e0.ivalue_ = 0x1954b8;
                                            lex((vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                local_388,(wstring_view *)local_2e8);
                                            local_368._0_8_ = ptVar9;
                                            std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                                      ((wstring *)local_368,L"test",L"");
                                            mjs::token::token((token *)local_2e8,identifier,
                                                              (wstring *)local_368);
                                            __l_09._M_len = 1;
                                            __l_09._M_array = (iterator)local_2e8;
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            vector((vector<mjs::token,_std::allocator<mjs::token>_>
                                                    *)local_348,__l_09,(allocator_type *)&local_318)
                                            ;
                                            mjs::token::destroy((token *)local_2e8);
                                            if ((token *)local_368._0_8_ != ptVar9) {
                                              operator_delete((void *)local_368._0_8_,
                                                              local_368._16_8_ * 4 + 4);
                                            }
                                            ptVar11 = (token *)local_348._0_8_;
                                            uVar1 = local_388._8_8_;
                                            ptVar7 = (token *)local_388._0_8_;
                                            if (local_388._8_8_ - local_388._0_8_ ==
                                                local_348._8_8_ - local_348._0_8_) {
                                              bVar12 = local_388._0_8_ == local_388._8_8_;
                                              if (bVar12) {
LAB_001140e3:
                                                if (bVar12) {
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.20228022599804e-318;
                                                  lex(&local_318,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"a",L"");
                                                  mjs::token::token((token *)local_2e8,identifier,
                                                                    (wstring *)local_368);
                                                  local_2c0.type_ = whitespace;
                                                  ptVar7 = (token *)(local_388 + 0x10);
                                                  local_388._0_8_ = ptVar7;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_388,L"b",L"");
                                                  mjs::token::token(&local_298,identifier,
                                                                    (wstring *)local_388);
                                                  local_270 = 0;
                                                  ptVar11 = (token *)(local_348 + 0x10);
                                                  local_348._0_8_ = ptVar11;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_348,L"cd",L"");
                                                  mjs::token::token(&local_248,identifier,
                                                                    (wstring *)local_348);
                                                  __l_10._M_len = 5;
                                                  __l_10._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&local_300,__l_10,&local_319);
                                                  lVar6 = 0xa0;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if ((token *)local_348._0_8_ != ptVar11) {
                                                    operator_delete((void *)local_348._0_8_,
                                                                    local_348._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_388._0_8_ != ptVar7) {
                                                    operator_delete((void *)local_388._0_8_,
                                                                    local_388._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = local_300.
                                                                                                                        
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  ptVar2 = local_318.
                                                                                                                      
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  ptVar8 = local_318.
                                                                                                                      
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if ((long)local_318.
                                                                                                                        
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_318.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) {
                                                    bVar12 = local_318.
                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  local_318.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  if (bVar12) {
LAB_001143d3:
                                                    if (bVar12) {
                                                      std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_300);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_318);
                                                  local_2e8 = (undefined1  [8])0xa;
                                                  local_2e0.dvalue_ = 8.20241856437887e-318;
                                                  lex(&local_318,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"$",L"");
                                                  mjs::token::token((token *)local_2e8,identifier,
                                                                    (wstring *)local_368);
                                                  local_2c0.type_ = whitespace;
                                                  local_388._0_8_ = ptVar7;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_388,L"_",L"");
                                                  mjs::token::token(&local_298,identifier,
                                                                    (wstring *)local_388);
                                                  local_270 = 0;
                                                  local_348._0_8_ = ptVar11;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_348,L"$foo2_",L"");
                                                  mjs::token::token(&local_248,identifier,
                                                                    (wstring *)local_348);
                                                  __l_11._M_len = 5;
                                                  __l_11._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&local_300,__l_11,&local_319);
                                                  lVar6 = 0xa0;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if ((token *)local_348._0_8_ != ptVar11) {
                                                    operator_delete((void *)local_348._0_8_,
                                                                    local_348._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_388._0_8_ != ptVar7) {
                                                    operator_delete((void *)local_388._0_8_,
                                                                    local_388._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = local_300.
                                                                                                                        
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  ptVar2 = local_318.
                                                                                                                      
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  ptVar8 = local_318.
                                                                                                                      
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if ((long)local_318.
                                                                                                                        
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_318.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) {
                                                    bVar12 = local_318.
                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  local_318.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  if (bVar12) {
LAB_001146bc:
                                                    if (bVar12) {
                                                      std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_300);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_318);
                                                  local_2e8 = (undefined1  [8])0x2;
                                                  local_2e0.dvalue_ = 8.20267547851471e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x3ff0000000000000;
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"a",L"");
                                                  mjs::token::token(&local_2c0,identifier,
                                                                    (wstring *)local_368);
                                                  __l_12._M_len = 2;
                                                  __l_12._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_12,(allocator_type *)&local_318);
                                                  lVar6 = 0x28;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_001148f8:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.20273476639221e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x13;
                                                  local_2c0.type_ = rshiftshiftequal;
                                                  __l_13._M_len = 2;
                                                  __l_13._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_13,(allocator_type *)local_348);
                                                  lVar6 = 0x28;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    uVar1 = local_368._8_8_;
                                                    ptVar8 = (token *)local_368._0_8_;
                                                    ptVar10 = (token *)local_388._0_8_;
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00114ada:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  vVar3 = tested_version();
                                                  if (vVar3 == es1) {
                                                    local_2e8 = (undefined1  [8])0x7;
                                                    local_2e0.dvalue_ = 8.20287310477305e-318;
                                                    lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x1d;
                                                  local_2c0.type_ = whitespace;
                                                  local_298.type_ = equal;
                                                  local_270 = 0;
                                                  local_248.type_ = equalequal;
                                                  local_220 = 0x1d;
                                                  __l_16._M_len = 6;
                                                  __l_16._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_16,(allocator_type *)local_348);
                                                  lVar6 = 200;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    uVar1 = local_368._8_8_;
                                                    ptVar8 = (token *)local_368._0_8_;
                                                    ptVar10 = (token *)local_388._0_8_;
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115083:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x3;
                                                  local_2e0.dvalue_ = 8.20303120577972e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0xc;
                                                  local_2c0.type_ = equal;
                                                  __l_17._M_len = 2;
                                                  __l_17._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_17,(allocator_type *)local_348);
                                                  lVar6 = 0x28;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    uVar1 = local_368._8_8_;
                                                    ptVar8 = (token *)local_368._0_8_;
                                                    ptVar10 = (token *)local_388._0_8_;
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115265:
                                                      if (bVar12) goto LAB_0011526d;
                                                    }
                                                    else {
                                                      bVar12 = mjs::operator==((token *)local_368.
                                                                                        _0_8_,
                                                                               (token *)local_388.
                                                                                        _0_8_);
                                                      if (bVar12) {
                                                        do {
                                                          ptVar10 = ptVar10 + 1;
                                                          ptVar8 = ptVar8 + 1;
                                                          bVar12 = ptVar8 == (token *)uVar1;
                                                          if (bVar12) goto LAB_00115265;
                                                          bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                        } while (bVar12);
                                                      }
                                                    }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x4f);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,"lex(LR\"(!==)\")"
                                                                          );
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::notequal}, token{token_type::equal})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00115083;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x4e);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(= = ===)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequal}, token{token_type::equal})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  local_2e8 = (undefined1  [8])0x7;
                                                  local_2e0.dvalue_ = 8.20287310477305e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x1d;
                                                  local_2c0.type_ = whitespace;
                                                  local_298.type_ = equal;
                                                  local_270 = 0;
                                                  local_248.type_ = equalequalequal;
                                                  __l_14._M_len = 5;
                                                  __l_14._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_14,(allocator_type *)local_348);
                                                  lVar6 = 0xa0;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    uVar1 = local_368._8_8_;
                                                    ptVar8 = (token *)local_368._0_8_;
                                                    ptVar10 = (token *)local_388._0_8_;
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00114cd8:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x3;
                                                  local_2e0.dvalue_ = 8.20303120577972e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 10;
                                                  __l_15._M_len = 1;
                                                  __l_15._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_15,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00114ea1:
                                                      if (bVar12) {
LAB_0011526d:
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x4;
                                                  local_2e0.dvalue_ = 8.20311025628305e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x5a;
                                                  __l_18._M_len = 1;
                                                  __l_18._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_18,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_0011542e:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x4;
                                                  local_2e0.dvalue_ = 8.20320906941222e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x69;
                                                  __l_19._M_len = 1;
                                                  __l_19._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_19,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_001155f7:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x5;
                                                  local_2e0.dvalue_ = 8.20330788254139e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x48;
                                                  __l_20._M_len = 1;
                                                  __l_20._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_20,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_001157c0:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x2;
                                                  local_2e0.dvalue_ = 8.20342645829639e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x404e000000000000;
                                                  __l_21._M_len = 1;
                                                  __l_21._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_21,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115997:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x7;
                                                  local_2e0.dvalue_ = 8.20348574617389e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x405ec7df3b645a1d;
                                                  __l_22._M_len = 1;
                                                  __l_22._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_22,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115b6e:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.20364384718056e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x7ff0000000000000;
                                                  __l_23._M_len = 1;
                                                  __l_23._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_23,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115d45:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.2037821855614e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 2;
                                                  __l_24._M_len = 1;
                                                  __l_24._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_24,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00115f16:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.20392052394223e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0;
                                                  __l_25._M_len = 1;
                                                  __l_25._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_25,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_001160e7:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x5;
                                                  local_2e0.dvalue_ = 8.20405886232307e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x4045200000000000;
                                                  __l_26._M_len = 1;
                                                  __l_26._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_26,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_001162be:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x6;
                                                  local_2e0.dvalue_ = 8.20417743807807e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x405bc00000000000;
                                                  __l_27._M_len = 1;
                                                  __l_27._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_27,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00116495:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x5;
                                                  local_2e0.dvalue_ = 8.2043157764589e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x4070000000000000;
                                                  __l_28._M_len = 1;
                                                  __l_28._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_28,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  uVar1 = local_368._8_8_;
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_0011666c:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0x4;
                                                  local_2e0.dvalue_ = 8.20443435221391e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 3;
                                                  local_2e0.ivalue_ = 0x4054c00000000000;
                                                  __l_29._M_len = 1;
                                                  __l_29._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,__l_29,(allocator_type *)local_348);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  ptVar8 = (token *)local_368._0_8_;
                                                  ptVar10 = (token *)local_388._0_8_;
                                                  if (local_368._8_8_ - local_368._0_8_ ==
                                                      local_388._8_8_ - local_388._0_8_) {
                                                    bVar12 = local_368._0_8_ == local_368._8_8_;
                                                    if (bVar12) {
LAB_00116843:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  local_2e8 = (undefined1  [8])0xd;
                                                  local_2e0.dvalue_ = 8.20453316534307e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"test \"\" str",
                                                             L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_30._M_len = 1;
                                                  __l_30._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_30,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00116a54:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0xc;
                                                  local_2e0.dvalue_ = 8.20504699361475e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"blahblah\'\'",
                                                             L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_31._M_len = 1;
                                                  __l_31._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_31,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00116c62:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x12;
                                                  local_2e0.dvalue_ = 8.20552129663476e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,
                                                             L"\'\"\\\b\f\n\r\t",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_32._M_len = 1;
                                                  __l_32._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_32,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00116e70:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x3;
                                                  local_2e0.dvalue_ = 8.2060746501581e-318;
                                                  check_lex_fails_abi_cxx11_
                                                            (&local_50,(wstring_view *)local_2e8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_50._M_dataplus._M_p != &local_50.field_2)
                                                  {
                                                    operator_delete(local_50._M_dataplus._M_p,
                                                                    local_50.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  vVar3 = tested_version();
                                                  if (1 < (int)vVar3) {
                                                    local_2e8 = (undefined1  [8])0xd;
                                                    local_2e0.dvalue_ = 8.20615370066143e-318;
                                                    lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"Testblah!",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_33._M_len = 1;
                                                  __l_33._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_33,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_0011711d:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  goto LAB_00117137;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_0011711d;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x72);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(line_continuation)");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"Testblah!\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  local_2e8 = (undefined1  [8])0xd;
                                                  local_2e0.dvalue_ = 8.20615370066143e-318;
                                                  check_lex_fails_abi_cxx11_
                                                            (&local_70,(wstring_view *)local_2e8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_70._M_dataplus._M_p != &local_70.field_2)
                                                  {
                                                    operator_delete(local_70._M_dataplus._M_p,
                                                                    local_70.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
LAB_00117137:
                                                  vVar3 = tested_version();
                                                  if (vVar3 == es1) {
                                                    local_2e8 = (undefined1  [8])0x4;
                                                    local_2e0.dvalue_ = 8.20662800368144e-318;
                                                    check_lex_fails_abi_cxx11_
                                                              (&local_90,(wstring_view *)local_2e8);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_90._M_dataplus._M_p != &local_90.field_2)
                                                  {
                                                    operator_delete(local_90._M_dataplus._M_p,
                                                                    local_90.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
LAB_0011738f:
                                                  local_2e8 = (undefined1  [8])0xa;
                                                  local_2e0.dvalue_ = 8.20676634206228e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"«\n",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_35._M_len = 1;
                                                  __l_35._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_35,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00117583:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0xf;
                                                  local_2e0.dvalue_ = 8.20704301882395e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"\a?S 0",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_36._M_len = 1;
                                                  __l_36._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_36,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00117791:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x8;
                                                  local_2e0.dvalue_ = 8.20747779659229e-318;
                                                  lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"ሴ",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_37._M_len = 1;
                                                  __l_37._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_37,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_0011799f:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  local_2e8 = (undefined1  [8])0x16;
                                                  local_2e0.dvalue_ = 8.20769518547646e-318;
                                                  lex(&local_318,(wstring_view *)local_2e8);
                                                  local_2e8._0_4_ = 0x4f;
                                                  local_2c0.type_ = whitespace;
                                                  local_298.type_ = lparen;
                                                  local_270 = 3;
                                                  local_268 = 0x3ff0000000000000;
                                                  local_248.type_ = rparen;
                                                  local_220 = 0;
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"foo",L"");
                                                  mjs::token::token(&local_1f8,identifier,
                                                                    (wstring *)local_368);
                                                  local_1d0 = 0x32;
                                                  local_388._0_8_ = ptVar7;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_388,L"x",L"");
                                                  mjs::token::token(&local_1a8,string_literal,
                                                                    (wstring *)local_388);
                                                  local_180 = 0x33;
                                                  local_158 = 0x1d;
                                                  local_348._0_8_ = ptVar11;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_348,L"bar",L"");
                                                  mjs::token::token(&local_130,identifier,
                                                                    (wstring *)local_348);
                                                  local_108 = 0x2e;
                                                  local_e0 = 0x2f;
                                                  local_b8 = 0x34;
                                                  __l_38._M_len = 0xf;
                                                  __l_38._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&local_300,__l_38,&local_319);
                                                  lVar6 = 0x230;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e8 + lVar6)
                                                                       );
                                                    lVar6 = lVar6 + -0x28;
                                                  } while (lVar6 != -0x28);
                                                  if ((token *)local_348._0_8_ != ptVar11) {
                                                    operator_delete((void *)local_348._0_8_,
                                                                    local_348._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_388._0_8_ != ptVar7) {
                                                    operator_delete((void *)local_388._0_8_,
                                                                    local_388._16_8_ * 4 + 4);
                                                  }
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  if ((long)local_318.
                                                                                                                        
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_318.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_300.
                                                                                                                
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) {
                                                    bVar12 = local_318.
                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  local_318.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  if (bVar12) {
LAB_00117cea:
                                                    if (bVar12) {
                                                      std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_300);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&local_318);
                                                  return;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==(local_318.
                                                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_300.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (bVar12) {
                                                    do {
                                                      ptVar9 = local_318.
                                                                                                                              
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1;
                                                  bVar12 = ptVar9 == local_318.
                                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  if (bVar12) goto LAB_00117cea;
                                                  bVar12 = mjs::operator==(ptVar9,local_300.
                                                                                                                                                                    
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                                  local_318.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start = ptVar9
                                                  ;
                                                  local_300.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_300.
                                                                                                              
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1;
                                                  } while (bVar12);
                                                  }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x84);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(if (1) foo[\'x\']=bar();)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::if_}, token{token_type::whitespace}, token{token_type::lparen}, token{1.}, token{token_type::rparen}, token{token_type::whitespace}, token{token_type::identifier, L\"foo\"}, token{token_type::lbracket}, token{token_type::string_literal, L\"x\"}, token{token_type::rbracket}, token{token_type::equal}, token{token_type::identifier, L\"bar\"}, token{token_type::lparen}, token{token_type::rparen}, token{token_type::semicolon})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,&local_318);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,&local_300);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)local_388._8_8_;
                                                        if (bVar12) goto LAB_0011799f;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x81);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\'\\u1234\')\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x1234\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00117791;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x7f);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\'\\7\\77\\123\\400\')\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x07\\x3f\\x53\\x20\\x30\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00117583;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x7d);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\'\\xAB\\x0A\')\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"\\xAB\\n\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  }
                                                  else {
                                                    local_2e8 = (undefined1  [8])0x4;
                                                    local_2e0.dvalue_ = 8.20662800368144e-318;
                                                    lex((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388,(wstring_view *)local_2e8);
                                                  local_368._0_8_ = ptVar9;
                                                  std::__cxx11::wstring::
                                                  _M_construct<wchar_t_const*>
                                                            ((wstring *)local_368,L"\v",L"");
                                                  mjs::token::token((token *)local_2e8,
                                                                    string_literal,
                                                                    (wstring *)local_368);
                                                  __l_34._M_len = 1;
                                                  __l_34._M_array = (iterator)local_2e8;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348,__l_34,(allocator_type *)&local_318);
                                                  mjs::token::destroy((token *)local_2e8);
                                                  if ((token *)local_368._0_8_ != ptVar9) {
                                                    operator_delete((void *)local_368._0_8_,
                                                                    local_368._16_8_ * 4 + 4);
                                                  }
                                                  ptVar10 = (token *)local_348._0_8_;
                                                  uVar1 = local_388._8_8_;
                                                  ptVar8 = (token *)local_388._0_8_;
                                                  if (local_388._8_8_ - local_388._0_8_ ==
                                                      local_348._8_8_ - local_348._0_8_) {
                                                    bVar12 = local_388._0_8_ == local_388._8_8_;
                                                    if (bVar12) {
LAB_00117338:
                                                      if (bVar12) {
                                                        std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector((
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  goto LAB_0011738f;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00117338;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x7a);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(vert_tab_str)");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x0B\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  }
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00116e70;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x69);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\'\\\'\\\"\\\\\\b\\f\\n\\r\\t\')\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"\\\'\\\"\\\\\\b\\f\\n\\r\\t\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00116c62;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x67);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\"blahblah\'\'\")\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"blahblah\'\'\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00116a54;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x66);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(\'test \"\" str\')\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::string_literal, L\"test \\\"\\\" str\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)local_368._8_8_;
                                                        if (bVar12) goto LAB_00116843;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,100);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(0123)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{83})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_0011666c;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,99);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(0x100)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{256})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00116495;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x62);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(1.11e2)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{111})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_001162be;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x61);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(42.25)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{42.25})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_001160e7;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x60);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(1E-324)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,"TOKENS(token{0})"
                                                                          );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00115f16;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x5f);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(1E-323)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{1e-323})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00115d45;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x5e);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(1E+309)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{(__builtin_inff ())})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00115b6e;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x5d);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(123.123)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{123.123})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00115997;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x5c);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,"lex(LR\"(60)\")")
                                                  ;
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{60.})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_001157c0;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x5a);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(false)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::false_})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_001155f7;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x59);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(true)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::true_})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_0011542e;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x57);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(null)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::null_})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00114ea1;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x53);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,"lex(LR\"(!==)\")"
                                                                          );
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::notequalequal})");
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00114cd8;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x52);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(= = ===)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequalequal})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_368.
                                                                                      _0_8_,
                                                                             (token *)local_388.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_00114ada;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x4c);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(LR\"(<<>>>=)\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::lshift}, token{token_type::rshiftshiftequal})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==((token *)local_388.
                                                                                      _0_8_,
                                                                             (token *)local_348.
                                                                                      _0_8_);
                                                    if (bVar12) {
                                                      do {
                                                        ptVar10 = ptVar10 + 1;
                                                        ptVar8 = ptVar8 + 1;
                                                        bVar12 = ptVar8 == (token *)uVar1;
                                                        if (bVar12) goto LAB_001148f8;
                                                        bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                      } while (bVar12);
                                                    }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x4a);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,"lex(L\"1a\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{1.}, token{token_type::identifier, L\"a\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==(local_318.
                                                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_300.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (bVar12) {
                                                    do {
                                                      ptVar10 = ptVar10 + 1;
                                                      ptVar8 = ptVar8 + 1;
                                                      bVar12 = ptVar8 == ptVar2;
                                                      if (bVar12) goto LAB_001146bc;
                                                      bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                    } while (bVar12);
                                                  }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x49);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "lex(L\"$ _ $foo2_\")");
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::identifier, L\"$\"}, token{token_type::whitespace}, token{token_type::identifier, L\"_\"}, token{token_type::whitespace}, token{token_type::identifier, L\"$foo2_\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,&local_318);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,&local_300);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                  }
                                                  }
                                                  else {
                                                    bVar12 = mjs::operator==(local_318.
                                                                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_300.
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (bVar12) {
                                                    do {
                                                      ptVar10 = ptVar10 + 1;
                                                      ptVar8 = ptVar8 + 1;
                                                      bVar12 = ptVar8 == ptVar2;
                                                      if (bVar12) goto LAB_001143d3;
                                                      bVar12 = mjs::operator==(ptVar8,ptVar10);
                                                    } while (bVar12);
                                                  }
                                                  }
                                                  }
                                                  pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar4 = std::operator<<(pwVar4," in ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,":");
                                                  pwVar4 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar4,0x48);
                                                  pwVar4 = std::operator<<(pwVar4,":\n");
                                                  pwVar4 = std::operator<<(pwVar4,"lex(L\"a b cd\")"
                                                                          );
                                                  pwVar4 = std::operator<<(pwVar4," != ");
                                                  pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::identifier, L\"a\"}, token{token_type::whitespace}, token{token_type::identifier, L\"b\"}, token{token_type::whitespace}, token{token_type::identifier, L\"cd\"})"
                                                  );
                                                  pwVar4 = std::operator<<(pwVar4,"\n");
                                                  pbVar5 = operator<<(pwVar4,&local_318);
                                                  pwVar4 = std::operator<<(pbVar5," != ");
                                                  pbVar5 = operator<<(pwVar4,&local_300);
                                                  pwVar4 = std::operator<<(pbVar5,"\n");
                                                  vVar3 = tested_version();
                                                  pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                                  std::operator<<(pbVar5,"\n");
                                                  goto LAB_00117ce5;
                                                }
                                              }
                                              else {
                                                bVar12 = mjs::operator==((token *)local_388._0_8_,
                                                                         (token *)local_348._0_8_);
                                                if (bVar12) {
                                                  do {
                                                    ptVar11 = ptVar11 + 1;
                                                    ptVar7 = ptVar7 + 1;
                                                    bVar12 = ptVar7 == (token *)uVar1;
                                                    if (bVar12) goto LAB_001140e3;
                                                    bVar12 = mjs::operator==(ptVar7,ptVar11);
                                                  } while (bVar12);
                                                }
                                              }
                                            }
                                            pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                                                     "basic_tests");
                                            pwVar4 = std::operator<<(pwVar4," in ");
                                            pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                            pwVar4 = std::operator<<(pwVar4,":");
                                            pwVar4 = (wostream *)
                                                     std::wostream::operator<<
                                                               ((wostream *)pwVar4,0x47);
                                            pwVar4 = std::operator<<(pwVar4,":\n");
                                            pwVar4 = std::operator<<(pwVar4,"lex(LR\"(test)\")");
                                            pwVar4 = std::operator<<(pwVar4," != ");
                                            pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::identifier, L\"test\"})"
                                                  );
                                            pwVar4 = std::operator<<(pwVar4,"\n");
                                            pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                            pwVar4 = std::operator<<(pbVar5," != ");
                                            pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                            pwVar4 = std::operator<<(pbVar5,"\n");
                                            vVar3 = tested_version();
                                            pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                            std::operator<<(pbVar5,"\n");
                                            goto LAB_00117ce5;
                                          }
                                        }
                                        else {
                                          bVar12 = mjs::operator==((token *)local_368._0_8_,
                                                                   (token *)local_388._0_8_);
                                          if (bVar12) {
                                            do {
                                              ptVar11 = ptVar11 + 1;
                                              ptVar7 = ptVar7 + 1;
                                              bVar12 = ptVar7 == (token *)uVar1;
                                              if (bVar12) goto LAB_00113ed6;
                                              bVar12 = mjs::operator==(ptVar7,ptVar11);
                                            } while (bVar12);
                                          }
                                        }
                                      }
                                      pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests"
                                                              );
                                      pwVar4 = std::operator<<(pwVar4," in ");
                                      pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                      pwVar4 = std::operator<<(pwVar4,":");
                                      pwVar4 = (wostream *)
                                               std::wostream::operator<<((wostream *)pwVar4,0x45);
                                      pwVar4 = std::operator<<(pwVar4,":\n");
                                      pwVar4 = std::operator<<(pwVar4,"lex(LR\"(for)\")");
                                      pwVar4 = std::operator<<(pwVar4," != ");
                                      pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::for_})");
                                      pwVar4 = std::operator<<(pwVar4,"\n");
                                      pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_368);
                                      pwVar4 = std::operator<<(pbVar5," != ");
                                      pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                      pwVar4 = std::operator<<(pbVar5,"\n");
                                      vVar3 = tested_version();
                                      pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                      std::operator<<(pbVar5,"\n");
                                      goto LAB_00117ce5;
                                    }
                                  }
                                  else {
                                    bVar12 = mjs::operator==((token *)local_388._0_8_,
                                                             (token *)local_348._0_8_);
                                    if (bVar12) {
                                      do {
                                        ptVar11 = ptVar11 + 1;
                                        ptVar7 = ptVar7 + 1;
                                        bVar12 = ptVar7 == (token *)uVar1;
                                        if (bVar12) goto LAB_00113d0d;
                                        bVar12 = mjs::operator==(ptVar7,ptVar11);
                                      } while (bVar12);
                                    }
                                  }
                                }
                                pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                                pwVar4 = std::operator<<(pwVar4," in ");
                                pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                pwVar4 = std::operator<<(pwVar4,":");
                                pwVar4 = (wostream *)
                                         std::wostream::operator<<((wostream *)pwVar4,0x43);
                                pwVar4 = std::operator<<(pwVar4,":\n");
                                pwVar4 = std::operator<<(pwVar4,"lex(L\"x//test\\n\")");
                                pwVar4 = std::operator<<(pwVar4," != ");
                                pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                                                  );
                                pwVar4 = std::operator<<(pwVar4,"\n");
                                pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                                pwVar4 = std::operator<<(pbVar5," != ");
                                pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                                pwVar4 = std::operator<<(pbVar5,"\n");
                                vVar3 = tested_version();
                                pbVar5 = mjs::operator<<(pwVar4,vVar3);
                                std::operator<<(pbVar5,"\n");
                                goto LAB_00117ce5;
                              }
                            }
                            else {
                              bVar12 = mjs::operator==((token *)local_388._0_8_,
                                                       (token *)local_348._0_8_);
                              if (bVar12) {
                                do {
                                  ptVar11 = ptVar11 + 1;
                                  ptVar7 = ptVar7 + 1;
                                  bVar12 = ptVar7 == (token *)uVar1;
                                  if (bVar12) goto LAB_00113ad0;
                                  bVar12 = mjs::operator==(ptVar7,ptVar11);
                                } while (bVar12);
                              }
                            }
                          }
                          pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                          pwVar4 = std::operator<<(pwVar4," in ");
                          pwVar4 = std::operator<<(pwVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                          pwVar4 = std::operator<<(pwVar4,":");
                          pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x42);
                          pwVar4 = std::operator<<(pwVar4,":\n");
                          pwVar4 = std::operator<<(pwVar4,"lex(L\"x//test\")");
                          pwVar4 = std::operator<<(pwVar4," != ");
                          pwVar4 = std::operator<<(pwVar4,
                                                  "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace})"
                                                  );
                          pwVar4 = std::operator<<(pwVar4,"\n");
                          pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_388);
                          pwVar4 = std::operator<<(pbVar5," != ");
                          pbVar5 = operator<<(pwVar4,(
                                                  vector<mjs::token,_std::allocator<mjs::token>_> *)
                                                  local_348);
                          pwVar4 = std::operator<<(pbVar5,"\n");
                          vVar3 = tested_version();
                          pbVar5 = mjs::operator<<(pwVar4,vVar3);
                          std::operator<<(pbVar5,"\n");
                          goto LAB_00117ce5;
                        }
                      }
                      else {
                        bVar12 = mjs::operator==((token *)local_368._0_8_,(token *)local_388._0_8_);
                        if (bVar12) {
                          do {
                            ptVar11 = ptVar11 + 1;
                            ptVar7 = ptVar7 + 1;
                            bVar12 = ptVar7 == (token *)uVar1;
                            if (bVar12) goto LAB_00113898;
                            bVar12 = mjs::operator==(ptVar7,ptVar11);
                          } while (bVar12);
                        }
                      }
                    }
                    pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                    pwVar4 = std::operator<<(pwVar4," in ");
                    pwVar4 = std::operator<<(pwVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                            );
                    pwVar4 = std::operator<<(pwVar4,":");
                    pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x41);
                    pwVar4 = std::operator<<(pwVar4,":\n");
                    pwVar4 = std::operator<<(pwVar4,"lex(L\"/*hello\\nworld!*/\")");
                    pwVar4 = std::operator<<(pwVar4," != ");
                    pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::line_terminator})");
                    pwVar4 = std::operator<<(pwVar4,"\n");
                    pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                               local_368);
                    pwVar4 = std::operator<<(pbVar5," != ");
                    pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                               local_388);
                    pwVar4 = std::operator<<(pbVar5,"\n");
                    vVar3 = tested_version();
                    pbVar5 = mjs::operator<<(pwVar4,vVar3);
                    std::operator<<(pbVar5,"\n");
                    goto LAB_00117ce5;
                  }
                }
                else {
                  bVar12 = mjs::operator==((token *)local_368._0_8_,(token *)local_388._0_8_);
                  if (bVar12) {
                    do {
                      ptVar11 = ptVar11 + 1;
                      ptVar7 = ptVar7 + 1;
                      bVar12 = ptVar7 == (token *)uVar1;
                      if (bVar12) goto LAB_001136cf;
                      bVar12 = mjs::operator==(ptVar7,ptVar11);
                    } while (bVar12);
                  }
                }
              }
              pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
              pwVar4 = std::operator<<(pwVar4," in ");
              pwVar4 = std::operator<<(pwVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                      );
              pwVar4 = std::operator<<(pwVar4,":");
              pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x40);
              pwVar4 = std::operator<<(pwVar4,":\n");
              pwVar4 = std::operator<<(pwVar4,"lex(L\"/*hello world!*/\")");
              pwVar4 = std::operator<<(pwVar4," != ");
              pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::whitespace})");
              pwVar4 = std::operator<<(pwVar4,"\n");
              pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                         local_368);
              pwVar4 = std::operator<<(pbVar5," != ");
              pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)
                                         local_388);
              pwVar4 = std::operator<<(pbVar5,"\n");
              vVar3 = tested_version();
              pbVar5 = mjs::operator<<(pwVar4,vVar3);
              std::operator<<(pbVar5,"\n");
              goto LAB_00117ce5;
            }
          }
          else {
            bVar12 = mjs::operator==((token *)local_388._0_8_,(token *)local_348._0_8_);
            if (bVar12) {
              do {
                ptVar11 = ptVar11 + 1;
                ptVar7 = ptVar7 + 1;
                bVar12 = ptVar7 == (token *)uVar1;
                if (bVar12) goto LAB_001130f0;
                bVar12 = mjs::operator==(ptVar7,ptVar11);
              } while (bVar12);
            }
          }
        }
        pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
        pwVar4 = std::operator<<(pwVar4," in ");
        pwVar4 = std::operator<<(pwVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                );
        pwVar4 = std::operator<<(pwVar4,":");
        pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x39);
        pwVar4 = std::operator<<(pwVar4,":\n");
        pwVar4 = std::operator<<(pwVar4,"lex(L\"\\012x\\015\")");
        pwVar4 = std::operator<<(pwVar4," != ");
        pwVar4 = std::operator<<(pwVar4,
                                 "TOKENS(token{token_type::line_terminator}, token{token_type::identifier, L\"x\"}, token{token_type::line_terminator})"
                                );
        pwVar4 = std::operator<<(pwVar4,"\n");
        pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
        pwVar4 = std::operator<<(pbVar5," != ");
        pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_348);
        pwVar4 = std::operator<<(pbVar5,"\n");
        vVar3 = tested_version();
        pbVar5 = mjs::operator<<(pwVar4,vVar3);
        std::operator<<(pbVar5,"\n");
        goto LAB_00117ce5;
      }
    }
    else {
      bVar12 = mjs::operator==((token *)local_388._0_8_,(token *)local_348._0_8_);
      if (bVar12) {
        do {
          ptVar11 = ptVar11 + 1;
          ptVar7 = ptVar7 + 1;
          bVar12 = ptVar7 == (token *)uVar1;
          if (bVar12) goto LAB_00112ce6;
          bVar12 = mjs::operator==(ptVar7,ptVar11);
        } while (bVar12);
      }
    }
  }
  pwVar4 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
  pwVar4 = std::operator<<(pwVar4," in ");
  pwVar4 = std::operator<<(pwVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar4 = std::operator<<(pwVar4,":");
  pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0x33);
  pwVar4 = std::operator<<(pwVar4,":\n");
  pwVar4 = std::operator<<(pwVar4,"lex(L\"\\x09\\x0b\\x0c\\x20 ab\")");
  pwVar4 = std::operator<<(pwVar4," != ");
  pwVar4 = std::operator<<(pwVar4,
                           "TOKENS(token{token_type::whitespace}, token{token_type::identifier, L\"ab\"})"
                          );
  pwVar4 = std::operator<<(pwVar4,"\n");
  pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_388);
  pwVar4 = std::operator<<(pbVar5," != ");
  pbVar5 = operator<<(pwVar4,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_348);
  pwVar4 = std::operator<<(pbVar5,"\n");
  vVar3 = tested_version();
  pbVar5 = mjs::operator<<(pwVar4,vVar3);
  std::operator<<(pbVar5,"\n");
LAB_00117ce5:
  abort();
}

Assistant:

void basic_tests() {
    // Whitespace
    SIMPLE_TEST(L"\x09\x0b\x0c\x20 ab", WS, ID("ab"));
    if (tested_version() > version::es1) {
        // <NBSP> + <USP> are considered whitespace in ES3+
        SIMPLE_TEST(L"\xA0\x1680\x2000", WS);
    }
    // Line terminators
    SIMPLE_TEST(L"\012x\015", NL, ID("x"), NL);
    if (tested_version() > version::es1) {
        // In ES3+ \u2028 and \u2029 are considered line terminators
        SIMPLE_TEST(L"\x2028\x2029", NL);
        SIMPLE_TEST(L"x//\x2029", ID("x"), WS, NL);
    }
    // Comments
    SIMPLE_TEST(L"/*hello world!*/", WS);
    SIMPLE_TEST(L"/*hello\nworld!*/", NL);
    SIMPLE_TEST(L"x//test", ID("x"), WS);
    SIMPLE_TEST(L"x//test\n", ID("x"), WS, NL);
    // Reserver word
    SIMPLE_TEST(LR"(for)", T(for_));
    // Identifier
    SIMPLE_TEST(LR"(test)", ID("test"));
    SIMPLE_TEST(L"a b cd", ID("a"), WS, ID("b"), WS, ID("cd"));
    SIMPLE_TEST(L"$ _ $foo2_", ID("$"), WS, ID("_"), WS, ID("$foo2_"));
    SIMPLE_TEST(L"1a", token{1.}, ID("a"));
    // Punctuator
    SIMPLE_TEST(LR"(<<>>>=)", T(lshift), T(rshiftshiftequal));
    if (tested_version() == version::es1) {
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequal), T(equal));
        SIMPLE_TEST(LR"(!==)", T(notequal), T(equal));
    } else {
        // ===/ !== are new in ES3
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequalequal));
        SIMPLE_TEST(LR"(!==)", T(notequalequal));
    }
    // Literal
    //  - null literal
    SIMPLE_TEST(LR"(null)", T(null_));
    //  - boolean literals
    SIMPLE_TEST(LR"(true)", T(true_));
    SIMPLE_TEST(LR"(false)", T(false_));
    //  - numeric literal
    SIMPLE_TEST(LR"(60)", token{60.});
    SIMPLE_TEST(LR"(123.123)", token{123.123});
    SIMPLE_TEST(LR"(1E+309)", token{INFINITY});
    SIMPLE_TEST(LR"(1E-323)", token{1e-323});
    SIMPLE_TEST(LR"(1E-324)", token{0});
    SIMPLE_TEST(LR"(42.25)", token{42.25});
    SIMPLE_TEST(LR"(1.11e2)", token{111});
    SIMPLE_TEST(LR"(0x100)", token{256});
    SIMPLE_TEST(LR"(0123)", token{83});
    //  - string literal
    SIMPLE_TEST(LR"('test "" str')", STR("test \"\" str"));
    SIMPLE_TEST(LR"("blahblah''")", STR("blahblah''"));
    //      SingleEscapeCharacter
    SIMPLE_TEST(LR"('\'\"\\\b\f\n\r\t')", STR("\'\"\\\b\f\n\r\t"));

    check_lex_fails(L"'\n'"); // an unescaped line terminator cannot appear in a string literal in any version

    // Line continutations aren't supported until ES5
    const auto line_continuation = L"'Test\\\nblah!'";
    if (tested_version() < version::es5) {
        check_lex_fails(line_continuation);
    } else {
        SIMPLE_TEST(line_continuation, STR("Testblah!"));
    }

    // Vertical tab (<VT>) supported from es3 on
    const auto vert_tab_str = LR"('\v')";
    if (tested_version() == version::es1) {
        check_lex_fails(vert_tab_str);
    } else {
        SIMPLE_TEST(vert_tab_str, STR("\x0B"));
    }
    //      HexEscapeSequence
    SIMPLE_TEST(LR"('\xAB\x0A')", STR("\xAB\n"));
    //      OctalEscapeSequence
    SIMPLE_TEST(LR"('\7\77\123\400')", STR("\x07\x3f\x53\x20\x30"));
    //      UnicodeEscapeSequence
    SIMPLE_TEST(LR"('\u1234')", STR("\x1234"));

    // A combined example
    SIMPLE_TEST(LR"(if (1) foo['x']=bar();)", T(if_), WS, T(lparen), token{1.}, T(rparen), WS, ID("foo"), T(lbracket), STR("x"), T(rbracket), T(equal), ID("bar"), T(lparen), T(rparen), T(semicolon));
}